

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O1

Au_Ntk_t * Au_NtkParseCBlif(char *pFileName)

{
  void *pvVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  FILE *__stream;
  char *__ptr;
  Vec_Int_t *p;
  int *piVar5;
  Au_Man_t *pMan;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  Au_Ntk_t *pAVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  ulong *puVar16;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\".\n",pFileName);
    return (Au_Ntk_t *)0x0;
  }
  __ptr = Extra_FileRead((FILE *)__stream);
  fclose(__stream);
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 1000;
  p->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p->pArray = piVar5;
  lVar13 = 0;
  Vec_IntPush(p,0);
  do {
    if (__ptr[lVar13] == '\n') {
      __ptr[lVar13] = '\0';
      Vec_IntPush(p,(int)lVar13 + 1);
    }
    else if (__ptr[lVar13] == '\0') break;
    lVar13 = lVar13 + 1;
  } while( true );
  pMan = Au_ManAlloc(pFileName);
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_00->pArray = piVar5;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 1000;
  p_01->nSize = 0;
  piVar5 = (int *)malloc(4000);
  p_01->pArray = piVar5;
  if (0 < p->nSize) {
    uVar12 = 0;
    pAVar9 = (Au_Ntk_t *)0x0;
    do {
      iVar14 = p->pArray[uVar12];
      pcVar6 = strtok(__ptr + iVar14," \t\r");
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '#')) {
        if (*pcVar6 == '.') {
          p_01->nSize = 0;
          iVar3 = strcmp(pcVar6,".and");
          if (iVar3 == 0) {
            iVar14 = 1;
            do {
              pcVar6 = strtok((char *)0x0," \t\r");
              uVar4 = atoi(pcVar6);
              uVar11 = (int)uVar4 >> 1;
              if (((int)uVar11 < 0) || (p_00->nSize <= (int)uVar11)) goto LAB_008635ed;
              Vec_IntPush(p_01,(uVar4 & 1) + p_00->pArray[uVar11] * 2);
              iVar14 = iVar14 + -1;
            } while (iVar14 == 0);
            iVar14 = 1;
          }
          else {
            iVar3 = strcmp(pcVar6,".xor");
            if (iVar3 == 0) {
              iVar14 = 1;
              do {
                pcVar6 = strtok((char *)0x0," \t\r");
                uVar4 = atoi(pcVar6);
                uVar11 = (int)uVar4 >> 1;
                if (((int)uVar11 < 0) || (p_00->nSize <= (int)uVar11)) goto LAB_008635ed;
                Vec_IntPush(p_01,(uVar4 & 1) + p_00->pArray[uVar11] * 2);
                iVar14 = iVar14 + -1;
              } while (iVar14 == 0);
              iVar14 = 2;
            }
            else {
              iVar3 = strcmp(pcVar6,".mux");
              if (iVar3 != 0) {
                iVar3 = strcmp(pcVar6,".subckt");
                if (iVar3 == 0) {
                  pcVar6 = strtok((char *)0x0," \t\r");
                  pcVar7 = strtok((char *)0x0," \t\r");
                  iVar14 = atoi(pcVar7);
                  pcVar7 = strtok((char *)0x0," \t\r");
                  iVar3 = atoi(pcVar7);
                  while ((pcVar7 = strtok((char *)0x0," \t\r"), pcVar7 != (char *)0x0 &&
                         (*pcVar7 != '#'))) {
                    Au_NtkParseCBlifNum(p_01,pcVar7,p_00);
                  }
                  if (p_01->nSize != iVar14) {
                    __assert_fail("Vec_IntSize(vFanins) == nInputs",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                                  ,0x41b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                  }
                  uVar4 = Au_NtkCreateBox(pAVar9,p_01,iVar3,(int)pcVar6 - (int)__ptr);
                  pvVar1 = (pAVar9->vPages).pArray[(int)uVar4 >> 0xc];
                  uVar8 = (ulong)((uVar4 & 0xfff) << 4);
                  uVar10 = *(ulong *)((long)pvVar1 + uVar8);
                  if ((uVar10 & 0x700000000) != 0x600000000) {
LAB_008635ce:
                    __assert_fail("Au_ObjIsBox(p)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                                  ,0xb5,"int Au_BoxFanoutNum(Au_Obj_t *)");
                  }
                  puVar16 = (ulong *)((long)pvVar1 + uVar8);
                  iVar14 = 0;
                  while (iVar14 < *(int *)((long)puVar16 + (uVar10 >> 0x23) * 4 + 8)) {
                    Vec_IntPush(p_00,*(int *)((long)puVar16 +
                                             (ulong)(iVar14 + (uint)(uVar10 >> 0x23) + 1) * 4 + 8));
                    uVar10 = *puVar16;
                    iVar14 = iVar14 + 1;
                    if ((uVar10 & 0x700000000) != 0x600000000) goto LAB_008635ce;
                  }
                }
                else {
                  iVar3 = strcmp(pcVar6,".model");
                  if (iVar3 == 0) {
                    pcVar6 = strtok((char *)0x0," \t\r");
                    pAVar9 = Au_NtkAlloc(pMan,pcVar6);
                    iVar14 = Au_NtkAllocObj(pAVar9,0,1);
                    p_00->nSize = 0;
                    Vec_IntPush(p_00,iVar14);
                  }
                  else {
                    iVar3 = strcmp(pcVar6,".inputs");
                    if (iVar3 == 0) {
                      pcVar6 = strtok((char *)0x0," \t\r");
                      iVar14 = atoi(pcVar6);
                      if (0 < iVar14) {
                        do {
                          iVar3 = Au_NtkAllocObj(pAVar9,0,2);
                          Vec_IntPush(p_00,iVar3);
                          iVar14 = iVar14 + -1;
                        } while (iVar14 != 0);
                      }
                    }
                    else {
                      iVar3 = strcmp(pcVar6,".outputs");
                      if (iVar3 == 0) {
                        pcVar6 = strtok((char *)0x0," \t\r");
                        iVar14 = atoi(pcVar6);
                        while ((pcVar6 = strtok((char *)0x0," \t\r"), pcVar6 != (char *)0x0 &&
                               (*pcVar6 != '#'))) {
                          Au_NtkParseCBlifNum(p_01,pcVar6,p_00);
                        }
                        if (p_01->nSize != iVar14) {
                          __assert_fail("Vec_IntSize(vFanins) == nOutputs",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                                        ,0x43b,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
                        }
                        if (0 < p_01->nSize) {
                          lVar13 = 0;
                          do {
                            Au_NtkCreatePo(pAVar9,p_01->pArray[lVar13]);
                            lVar13 = lVar13 + 1;
                          } while (lVar13 < p_01->nSize);
                        }
                      }
                      else {
                        iVar3 = strcmp(pcVar6,".end");
                        if (iVar3 != 0) {
                          pcVar6 = "Unknown directive in line %d: \"%s\".\n";
                          goto LAB_00862fcf;
                        }
                      }
                    }
                  }
                }
                goto LAB_00863311;
              }
              iVar14 = 3;
              do {
                pcVar6 = strtok((char *)0x0," \t\r");
                uVar4 = atoi(pcVar6);
                uVar11 = (int)uVar4 >> 1;
                if (((int)uVar11 < 0) || (p_00->nSize <= (int)uVar11)) goto LAB_008635ed;
                Vec_IntPush(p_01,(uVar4 & 1) + p_00->pArray[uVar11] * 2);
                iVar14 = iVar14 + -1;
              } while (iVar14 != 0);
              iVar14 = 3;
            }
          }
          iVar14 = Au_NtkCreateNode(pAVar9,p_01,iVar14);
          Vec_IntPush(p_00,iVar14);
        }
        else {
          pcVar6 = "Cannot read directive in line %d: \"%s\".\n";
LAB_00862fcf:
          printf(pcVar6,uVar12 & 0xffffffff,__ptr + iVar14);
        }
      }
LAB_00863311:
      uVar12 = uVar12 + 1;
    } while ((long)uVar12 < (long)p->nSize);
  }
  if (p_01->pArray != (int *)0x0) {
    free(p_01->pArray);
    p_01->pArray = (int *)0x0;
  }
  free(p_01);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
    p_00->pArray = (int *)0x0;
  }
  free(p_00);
  if (p->pArray != (int *)0x0) {
    free(p->pArray);
    p->pArray = (int *)0x0;
  }
  free(p);
  if (1 < (pMan->vNtks).nSize) {
    lVar13 = 1;
    do {
      if ((pMan->vNtks).nSize <= lVar13) goto LAB_0086362b;
      pvVar1 = (pMan->vNtks).pArray[lVar13];
      if (0 < *(int *)((long)pvVar1 + 0x3c)) {
        lVar15 = 0;
        do {
          if (*(int *)((long)pvVar1 + 0x3c) <= lVar15) {
LAB_008635ed:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar4 = *(uint *)(*(long *)((long)pvVar1 + 0x40) + lVar15 * 4);
          lVar2 = *(long *)(*(long *)((long)pvVar1 + 0x78) + (long)((int)uVar4 >> 0xc) * 8);
          uVar10 = (ulong)((uVar4 & 0xfff) << 4);
          uVar12 = *(ulong *)(lVar2 + uVar10);
          if ((uVar12 & 0x700000000) == 0x600000000) {
            puVar16 = (ulong *)(lVar2 + uVar10);
            uVar4 = Au_ManFindNtk(pMan,__ptr + ((uint)uVar12 & 0x3fffffff));
            *puVar16 = *puVar16 & 0xffffffffc0000000 | (ulong)(uVar4 & 0x3fffffff);
            if ((uVar4 & 0x3fffffff) == 0) {
              __assert_fail("pBox->Func > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                            ,0x44a,"Au_Ntk_t *Au_NtkParseCBlif(char *)");
            }
            uVar12 = *puVar16;
            if ((uVar12 & 0x700000000) != 0x600000000) goto LAB_008635ce;
            iVar14 = 0;
            while (iVar14 < *(int *)((long)puVar16 + (uVar12 >> 0x23) * 4 + 8)) {
              iVar3 = (uint)(uVar12 >> 0x23) + iVar14;
              iVar14 = iVar14 + 1;
              uVar4 = *(uint *)((long)puVar16 + (ulong)(iVar3 + 1) * 4 + 8);
              lVar2 = *(long *)(*(long *)(*(long *)((long)puVar16 - (ulong)((uint)puVar16 & 0x3ff))
                                         + 0x78) + (long)((int)uVar4 >> 0xc) * 8);
              uVar10 = (ulong)((uVar4 & 0xfff) << 4);
              *(ulong *)(lVar2 + uVar10) =
                   *(ulong *)(lVar2 + uVar10) & 0xffffffffc0000000 |
                   (ulong)((uint)uVar12 & 0x3fffffff);
              uVar12 = *puVar16;
              if ((uVar12 & 0x700000000) != 0x600000000) goto LAB_008635ce;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)((long)pvVar1 + 0x3c));
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (pMan->vNtks).nSize);
  }
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
  if (1 < (pMan->vNtks).nSize) {
    pAVar9 = (Au_Ntk_t *)(pMan->vNtks).pArray[1];
    Au_ManReorderModels(pMan,pAVar9);
    return pAVar9;
  }
LAB_0086362b:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Au_Ntk_t * Au_NtkParseCBlif( char * pFileName )
{
    FILE * pFile;
    Au_Man_t * pMan;
    Au_Ntk_t * pRoot = NULL;
    Au_Obj_t * pBox, * pFan;
    char * pBuffer, * pCur;
    Vec_Int_t * vLines, * vNum2Obj, * vFanins;
    int i, k, j, Id, nInputs, nOutputs;
    int Line, Num, Func;
    // read the file
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return NULL;
    }
    pBuffer = Extra_FileRead( pFile );
    fclose( pFile );
    // split into lines
    vLines = Vec_IntAlloc( 1000 );
    Vec_IntPush( vLines, 0 );
    for ( pCur = pBuffer; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            *pCur = 0;
            Vec_IntPush( vLines, pCur - pBuffer + 1 );
        }
    // start the manager
    pMan = Au_ManAlloc( pFileName );
    // parse the lines
    vNum2Obj = Vec_IntAlloc( 1000 );
    vFanins = Vec_IntAlloc( 1000 );
    Vec_IntForEachEntry( vLines, Line, i )
    {
        pCur = strtok( pBuffer + Line, " \t\r" );
        if ( pCur == NULL || *pCur == '#' )
            continue;
        if ( *pCur != '.' )
        {
            printf( "Cannot read directive in line %d: \"%s\".\n", i, pBuffer + Line );
            continue;
        }
        Vec_IntClear( vFanins );
        if ( !strcmp(pCur, ".and") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 1 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".xor") )
        {
            for ( k = 0; k < 2; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 2 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".mux") )
        {
            for ( k = 0; k < 3; k++ )
            {
                pCur = strtok( NULL, " \t\r" );
                Num  = atoi( pCur );
                Vec_IntPush( vFanins, Au_NtkRemapNum(vNum2Obj, Num) );
            }
            Id = Au_NtkCreateNode( pRoot, vFanins, 3 );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".subckt") )
        {
            pCur = strtok( NULL, " \t\r" );
            Func = pCur - pBuffer;
            pCur = strtok( NULL, " \t\r" );
            nInputs = atoi( pCur );
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break;
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nInputs );
            Id = Au_NtkCreateBox( pRoot, vFanins, nOutputs, Func );
            pBox = Au_NtkObj( pRoot, Id );
            Au_BoxForEachFanoutId( pBox, Num, k )
                Vec_IntPush( vNum2Obj, Num );
        }
        else if ( !strcmp(pCur, ".model") )
        {
            pCur  = strtok( NULL, " \t\r" );
            pRoot = Au_NtkAlloc( pMan, pCur );
            Id    = Au_NtkCreateConst0( pRoot );
            Vec_IntClear( vNum2Obj );
            Vec_IntPush( vNum2Obj, Id );
        }
        else if ( !strcmp(pCur, ".inputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            Num  = atoi( pCur );
            for ( k = 0; k < Num; k++ )
                Vec_IntPush( vNum2Obj, Au_NtkCreatePi(pRoot) );
        }
        else if ( !strcmp(pCur, ".outputs") )
        {
            pCur = strtok( NULL, " \t\r" );
            nOutputs = atoi( pCur );
            while ( 1 )
            {
                pCur = strtok( NULL, " \t\r" );
                if ( pCur == NULL || *pCur == '#' )
                    break; 
                Au_NtkParseCBlifNum( vFanins, pCur, vNum2Obj );
            }
            assert( Vec_IntSize(vFanins) == nOutputs );
            Vec_IntForEachEntry( vFanins, Num, k )
                Au_NtkCreatePo( pRoot, Num );
        }
        else if ( strcmp(pCur, ".end") )
            printf( "Unknown directive in line %d: \"%s\".\n", i, pBuffer + Line );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vNum2Obj );
    Vec_IntFree( vLines );
    // set pointers to models
    Au_ManForEachNtk( pMan, pRoot, i )
        Au_NtkForEachBox( pRoot, pBox, k )
        {
            pBox->Func = Au_ManFindNtk( pMan, pBuffer + pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    ABC_FREE( pBuffer );
    // order models in topological order
    pRoot = Au_ManNtkRoot( pMan );
    Au_ManReorderModels( pMan, pRoot );
    return pRoot;
}